

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::TestCaseInfo::TestCaseInfo
          (TestCaseInfo *this,StringRef _className,NameAndTags *_nameAndTags,
          SourceLineInfo *_lineInfo)

{
  size_type sVar1;
  char *pcVar2;
  bool bVar3;
  long lVar4;
  size_t sVar5;
  char cVar6;
  bool bVar7;
  TestCaseProperties TVar8;
  int iVar9;
  long *plVar10;
  char *pcVar11;
  __normal_iterator<Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_> _Var12;
  long *plVar13;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  size_type extraout_RDX_01;
  size_type extraout_RDX_02;
  size_type extraout_RDX_03;
  size_type sVar14;
  ulong uVar15;
  anon_unknown_26 *paVar16;
  char cVar17;
  ulong uVar18;
  char *pcVar19;
  pointer pTVar20;
  pointer pTVar21;
  StringRef filename;
  StringRef tag;
  StringRef tag_00;
  StringRef tagStr;
  StringRef tagStr_00;
  string __str;
  ReusableStringStream local_b0;
  string local_a0;
  SourceLineInfo *local_80;
  NameAndTags *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  SourceLineInfo *local_60;
  string *local_58;
  NameAndTags local_50;
  
  sVar1 = (_nameAndTags->name).m_size;
  sVar14 = sVar1;
  local_80 = _lineInfo;
  local_78 = _nameAndTags;
  if (sVar1 == 0) {
    uVar15 = (anonymous_namespace)::makeDefaultName[abi:cxx11]()::counter + 1;
    cVar17 = '\x01';
    if (9 < uVar15) {
      uVar18 = uVar15;
      cVar6 = '\x04';
      do {
        cVar17 = cVar6;
        if (uVar18 < 100) {
          cVar17 = cVar17 + -2;
          goto LAB_0014c94e;
        }
        if (uVar18 < 1000) {
          cVar17 = cVar17 + -1;
          goto LAB_0014c94e;
        }
        if (uVar18 < 10000) goto LAB_0014c94e;
        bVar3 = 99999 < uVar18;
        uVar18 = uVar18 / 10000;
        cVar6 = cVar17 + '\x04';
      } while (bVar3);
      cVar17 = cVar17 + '\x01';
    }
LAB_0014c94e:
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    (anonymous_namespace)::makeDefaultName[abi:cxx11]()::counter = uVar15;
    std::__cxx11::string::_M_construct((ulong)&local_a0,cVar17);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_a0._M_dataplus._M_p,(uint)local_a0._M_string_length,uVar15);
    plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x2a22c2);
    local_50.name.m_start = (char *)&local_50.tags;
    plVar13 = plVar10 + 2;
    if ((StringRef *)*plVar10 == (StringRef *)plVar13) {
      local_50.tags.m_start = (char *)*plVar13;
      local_50.tags.m_size = plVar10[3];
    }
    else {
      local_50.name.m_start = (char *)*plVar10;
      local_50.tags.m_start = (char *)*plVar13;
    }
    local_50.name.m_size = plVar10[1];
    *plVar10 = (long)plVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    _nameAndTags = &local_50;
    sVar14 = local_50.name.m_size;
  }
  pcVar2 = (_nameAndTags->name).m_start;
  local_68 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)this,pcVar2,pcVar2 + sVar14);
  if ((sVar1 == 0) && ((StringRef *)local_50.name.m_start != &local_50.tags)) {
    operator_delete(local_50.name.m_start,(ulong)(local_50.tags.m_start + 1));
  }
  (this->className).m_start = _className.m_start;
  (this->className).m_size = _className.m_size;
  local_70 = &(this->backingTags).field_2;
  (this->backingTags)._M_dataplus._M_p = (pointer)local_70;
  (this->backingTags)._M_string_length = 0;
  (this->backingTags).field_2._M_local_buf[0] = '\0';
  (this->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar5 = local_80->line;
  (this->lineInfo).file = local_80->file;
  (this->lineInfo).line = sVar5;
  this->properties = None;
  pcVar2 = (local_78->tags).m_start;
  sVar1 = (local_78->tags).m_size;
  paVar16 = (anon_unknown_26 *)local_80->file;
  pcVar11 = (char *)strlen((char *)paVar16);
  filename.m_size = extraout_RDX;
  filename.m_start = pcVar11;
  anon_unknown_26::extractFilenamePart(paVar16,filename);
  local_58 = &this->backingTags;
  std::__cxx11::string::reserve((ulong)&this->backingTags);
  if (sVar1 != 0) {
    local_60 = &this->lineInfo;
    uVar15 = 0;
    bVar3 = false;
    uVar18 = 0;
    sVar14 = extraout_RDX_00;
    do {
      if (pcVar2[uVar18] == ']') {
        if (!bVar3) {
          ReusableStringStream::ReusableStringStream(&local_b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_b0.m_oss,"Found unmatched \']\' while registering test case \'",0x31);
          std::ostream::write((char *)local_b0.m_oss,(long)(local_78->name).m_start);
          std::__ostream_insert<char,std::char_traits<char>>(local_b0.m_oss,"\' at ",5);
          operator<<(local_b0.m_oss,local_80);
          std::__cxx11::stringbuf::str();
          throw_domain_error(&local_a0);
        }
        if (uVar18 <= uVar15) {
          __assert_fail("tagStart < tagEnd",
                        "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                        ,0x5f0,
                        "Catch::TestCaseInfo::TestCaseInfo(StringRef, const NameAndTags &, const SourceLineInfo &)"
                       );
        }
        pcVar11 = (char *)(sVar1 - (uVar15 + 1));
        if ((char *)(~uVar15 + uVar18) <= pcVar11) {
          pcVar11 = (char *)(~uVar15 + uVar18);
        }
        if (pcVar11 == (char *)0x0) {
          ReusableStringStream::ReusableStringStream(&local_b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_b0.m_oss,"Found an empty tag while registering test case \'",0x30);
          std::ostream::write((char *)local_b0.m_oss,(long)(local_78->name).m_start);
          std::__ostream_insert<char,std::char_traits<char>>(local_b0.m_oss,"\' at ",5);
          operator<<(local_b0.m_oss,local_80);
          std::__cxx11::stringbuf::str();
          throw_domain_error(&local_a0);
        }
        paVar16 = (anon_unknown_26 *)(pcVar2 + uVar15 + 1);
        tag.m_size = sVar14;
        tag.m_start = pcVar11;
        TVar8 = anon_unknown_26::parseSpecialTag(paVar16,tag);
        sVar14 = extraout_RDX_01;
        if ((TVar8 == None) &&
           (iVar9 = isalnum((uint)(byte)*paVar16), sVar14 = extraout_RDX_02, iVar9 == 0)) {
          ReusableStringStream::ReusableStringStream(&local_b0);
          std::__ostream_insert<char,std::char_traits<char>>(local_b0.m_oss,"Tag name: [",0xb);
          std::ostream::write((char *)local_b0.m_oss,(long)paVar16);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_b0.m_oss,"] is not allowed.\n",0x12);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_b0.m_oss,
                     "Tag names starting with non alphanumeric characters are reserved\n",0x41);
          operator<<(local_b0.m_oss,local_60);
          std::__cxx11::stringbuf::str();
          throw_domain_error(&local_a0);
        }
        tag_00.m_size = sVar14;
        tag_00.m_start = pcVar11;
        TVar8 = anon_unknown_26::parseSpecialTag(paVar16,tag_00);
        this->properties = this->properties | TVar8;
        pcVar19 = (char *)0x1;
        if ((pcVar11 != (char *)0x1) && (pcVar19 = pcVar11, *paVar16 == (anon_unknown_26)0x2e)) {
          pcVar19 = pcVar11 + -1;
          paVar16 = (anon_unknown_26 *)(pcVar2 + uVar15 + 2);
        }
        tagStr.m_size = (size_type)pcVar19;
        tagStr.m_start = (char *)paVar16;
        internalAppendTag(this,tagStr);
        sVar14 = extraout_RDX_03;
        bVar7 = false;
      }
      else {
        bVar7 = bVar3;
        if ((pcVar2[uVar18] == '[') && (uVar15 = uVar18, bVar7 = true, bVar3)) {
          ReusableStringStream::ReusableStringStream(&local_b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_b0.m_oss,"Found \'[\' inside a tag while registering test case \'",0x34);
          std::ostream::write((char *)local_b0.m_oss,(long)(local_78->name).m_start);
          std::__ostream_insert<char,std::char_traits<char>>(local_b0.m_oss,"\' at ",5);
          operator<<(local_b0.m_oss,local_80);
          std::__cxx11::stringbuf::str();
          throw_domain_error(&local_a0);
        }
      }
      bVar3 = bVar7;
      uVar18 = uVar18 + 1;
    } while (sVar1 != uVar18);
    if (bVar3) {
      ReusableStringStream::ReusableStringStream(&local_b0);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_b0.m_oss,"Found an unclosed tag while registering test case \'",0x33);
      std::ostream::write((char *)local_b0.m_oss,(long)(local_78->name).m_start);
      std::__ostream_insert<char,std::char_traits<char>>(local_b0.m_oss,"\' at ",5);
      operator<<(local_b0.m_oss,local_80);
      std::__cxx11::stringbuf::str();
      throw_domain_error(&local_a0);
    }
  }
  if ((this->properties & IsHidden) != None) {
    tagStr_00.m_size = 1;
    tagStr_00.m_start = ".";
    internalAppendTag(this,tagStr_00);
  }
  pTVar21 = (this->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
            super__Vector_impl_data._M_start;
  pTVar20 = (this->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pTVar21 != pTVar20) {
    uVar15 = (long)pTVar20 - (long)pTVar21 >> 4;
    lVar4 = 0x3f;
    if (uVar15 != 0) {
      for (; uVar15 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Catch::Tag*,std::vector<Catch::Tag,std::allocator<Catch::Tag>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pTVar21,pTVar20,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Catch::Tag*,std::vector<Catch::Tag,std::allocator<Catch::Tag>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pTVar21,pTVar20);
    pTVar21 = (this->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
              super__Vector_impl_data._M_start;
    pTVar20 = (this->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  _Var12 = std::
           __unique<__gnu_cxx::__normal_iterator<Catch::Tag*,std::vector<Catch::Tag,std::allocator<Catch::Tag>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                     (pTVar21,pTVar20);
  if (_Var12._M_current !=
      (this->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    (this->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
    super__Vector_impl_data._M_finish = _Var12._M_current;
  }
  return;
}

Assistant:

TestCaseInfo::TestCaseInfo(StringRef _className,
                               NameAndTags const& _nameAndTags,
                               SourceLineInfo const& _lineInfo):
        name( _nameAndTags.name.empty() ? makeDefaultName() : _nameAndTags.name ),
        className( _className ),
        lineInfo( _lineInfo )
    {
        StringRef originalTags = _nameAndTags.tags;
        // We need to reserve enough space to store all of the tags
        // (including optional hidden tag and filename tag)
        auto requiredSize = originalTags.size() + sizeOfExtraTags(_lineInfo.file);
        backingTags.reserve(requiredSize);

        // We cannot copy the tags directly, as we need to normalize
        // some tags, so that [.foo] is copied as [.][foo].
        size_t tagStart = 0;
        size_t tagEnd = 0;
        bool inTag = false;
        for (size_t idx = 0; idx < originalTags.size(); ++idx) {
            auto c = originalTags[idx];
            if (c == '[') {
                CATCH_ENFORCE(
                    !inTag,
                    "Found '[' inside a tag while registering test case '"
                        << _nameAndTags.name << "' at " << _lineInfo );

                inTag = true;
                tagStart = idx;
            }
            if (c == ']') {
                CATCH_ENFORCE(
                    inTag,
                    "Found unmatched ']' while registering test case '"
                        << _nameAndTags.name << "' at " << _lineInfo );

                inTag = false;
                tagEnd = idx;
                assert(tagStart < tagEnd);

                // We need to check the tag for special meanings, copy
                // it over to backing storage and actually reference the
                // backing storage in the saved tags
                StringRef tagStr = originalTags.substr(tagStart+1, tagEnd - tagStart - 1);
                CATCH_ENFORCE( !tagStr.empty(),
                               "Found an empty tag while registering test case '"
                                   << _nameAndTags.name << "' at "
                                   << _lineInfo );

                enforceNotReservedTag(tagStr, lineInfo);
                properties |= parseSpecialTag(tagStr);
                // When copying a tag to the backing storage, we need to
                // check if it is a merged hide tag, such as [.foo], and
                // if it is, we need to handle it as if it was [foo].
                if (tagStr.size() > 1 && tagStr[0] == '.') {
                    tagStr = tagStr.substr(1, tagStr.size() - 1);
                }
                // We skip over dealing with the [.] tag, as we will add
                // it later unconditionally and then sort and unique all
                // the tags.
                internalAppendTag(tagStr);
            }
        }
        CATCH_ENFORCE( !inTag,
                       "Found an unclosed tag while registering test case '"
                           << _nameAndTags.name << "' at " << _lineInfo );


        // Add [.] if relevant
        if (isHidden()) {
            internalAppendTag("."_sr);
        }

        // Sort and prepare tags
        std::sort(begin(tags), end(tags));
        tags.erase(std::unique(begin(tags), end(tags)),
                   end(tags));
    }